

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  global_State *pgVar1;
  int iVar2;
  GCObject *pGVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  L_Umaxalign LVar8;
  
  if (l == 0) {
    uVar6 = 0;
  }
  else {
    uVar7 = l & 0xffffffff;
    sVar5 = l;
    do {
      uVar6 = (uint)uVar7 ^ (uint)(byte)str[sVar5 - 1] + (int)(uVar7 >> 2) + (uint)uVar7 * 0x20;
      uVar7 = (ulong)uVar6;
      sVar5 = sVar5 + ~(l >> 5);
    } while (l >> 5 < sVar5);
  }
  pgVar1 = L->l_G;
  LVar8 = (L_Umaxalign)
          ((L_Umaxalign *)
          ((pgVar1->strt).hash + ((long)(int)uVar6 & (long)(pgVar1->strt).size - 1U)))->s;
  while( true ) {
    if ((undefined8 *)LVar8.s == (undefined8 *)0x0) {
      if (0x19 < l + 0x1b) {
        pGVar3 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,l + 0x19);
        (pGVar3->h).metatable = (Table *)l;
        *(uint *)((long)pGVar3 + 0xc) = uVar6;
        (pGVar3->gch).marked = L->l_G->currentwhite & 3;
        (pGVar3->gch).tt = '\x04';
        (pGVar3->h).flags = '\0';
        memcpy(&(pGVar3->h).array,str,l);
        *(undefined1 *)((long)pGVar3 + l + 0x18) = 0;
        pgVar1 = L->l_G;
        uVar6 = (pgVar1->strt).size - 1U & uVar6;
        (pGVar3->gch).next = (pgVar1->strt).hash[uVar6];
        (pgVar1->strt).hash[uVar6] = pGVar3;
        uVar6 = (pgVar1->strt).size;
        uVar4 = (pgVar1->strt).nuse + 1;
        (pgVar1->strt).nuse = uVar4;
        if ((int)uVar6 < 0x3fffffff && uVar6 < uVar4) {
          luaS_resize(L,uVar6 * 2);
        }
        return (TString *)pGVar3;
      }
      luaG_runerror(L,"memory allocation error: block too big");
    }
    if ((*(size_t *)(LVar8.l + 0x10) == l) &&
       (iVar2 = bcmp(str,(TString *)(LVar8.l + 0x18),l), iVar2 == 0)) break;
    LVar8 = *LVar8.s;
  }
  if ((~pgVar1->currentwhite & *(lu_byte *)(LVar8.l + 9) & 3) == 0) {
    return (TString *)LVar8.u;
  }
  *(byte *)(LVar8.l + 9) = *(lu_byte *)(LVar8.l + 9) ^ 3;
  return (TString *)LVar8.u;
}

Assistant:

static TString*luaS_newlstr(lua_State*L,const char*str,size_t l){
GCObject*o;
unsigned int h=cast(unsigned int,l);
size_t step=(l>>5)+1;
size_t l1;
for(l1=l;l1>=step;l1-=step)
h=h^((h<<5)+(h>>2)+cast(unsigned char,str[l1-1]));
for(o=G(L)->strt.hash[lmod(h,G(L)->strt.size)];
o!=NULL;
o=o->gch.next){
TString*ts=rawgco2ts(o);
if(ts->tsv.len==l&&(memcmp(str,getstr(ts),l)==0)){
if(isdead(G(L),o))changewhite(o);
return ts;
}
}
return newlstr(L,str,l,h);
}